

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTcpIpConnection.cxx
# Opt level: O0

void __thiscall cmTcpIpConnection::Connect(cmTcpIpConnection *this,uv_stream_t *server)

{
  int iVar1;
  uv_handle_t *puVar2;
  uv_loop_t *ctx;
  uv_stream_t *puVar3;
  uv_stream_t *server_local;
  cmTcpIpConnection *this_local;
  
  puVar2 = ::auto_handle_base_::operator_cast_to_uv_handle_s_
                     ((auto_handle_base_ *)&this->ClientHandle);
  if (puVar2 == (uv_handle_t *)0x0) {
    ctx = cmServerBase::GetLoop((this->super_cmEventBasedConnection).super_cmConnection.Server);
    auto_tcp_t::init(&this->ClientHandle,(EVP_PKEY_CTX *)ctx);
    puVar3 = auto_tcp_t::operator_cast_to_uv_stream_s_(&this->ClientHandle);
    iVar1 = uv_accept(server,puVar3);
    if (iVar1 == 0) {
      puVar3 = auto_tcp_t::operator_cast_to_uv_stream_s_(&this->ClientHandle);
      (this->super_cmEventBasedConnection).ReadStream = puVar3;
      puVar3 = auto_tcp_t::operator_cast_to_uv_stream_s_(&this->ClientHandle);
      (this->super_cmEventBasedConnection).WriteStream = puVar3;
      uv_read_start((this->super_cmEventBasedConnection).ReadStream,
                    cmEventBasedConnection::on_alloc_buffer,cmEventBasedConnection::on_read);
      (*((this->super_cmEventBasedConnection).super_cmConnection.Server)->_vptr_cmServerBase[4])();
    }
    else {
      puVar2 = ::auto_handle_base_::operator_cast_to_uv_handle_s_
                         ((auto_handle_base_ *)&this->ClientHandle);
      uv_close(puVar2,(uv_close_cb)0x0);
    }
  }
  return;
}

Assistant:

void cmTcpIpConnection::Connect(uv_stream_t* server)
{
  if ((uv_handle_t*)this->ClientHandle) {
    // Ignore it; we already have a connection
    return;
  }

  this->ClientHandle.init(*this->Server->GetLoop(),
                          static_cast<cmConnection*>(this));
  if (uv_accept(server, this->ClientHandle) != 0) {
    uv_close(this->ClientHandle, nullptr);
    return;
  }
  this->ReadStream = this->ClientHandle;
  this->WriteStream = this->ClientHandle;

  uv_read_start(this->ReadStream, on_alloc_buffer, on_read);
  this->Server->OnConnected(this);
}